

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O1

void __thiscall
mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
          (section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this,
          string *name)

{
  long lVar1;
  ostream *poVar2;
  rep_conflict rVar3;
  double result;
  int rank;
  time_rep elapsed;
  int p;
  double local_a8;
  double local_a0;
  comm local_98;
  double local_78;
  custom_op<double,_true> local_70;
  double local_30;
  double local_28;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  local_78 = (double)(lVar1 - (this->start).__d.__r) / 1000000.0;
  local_98._vptr_comm = (_func_int **)&PTR__comm_00150510;
  local_98.mpi_comm = this->comm;
  local_98.do_free = false;
  MPI_Comm_size(local_98.mpi_comm,&local_98.m_size);
  MPI_Comm_rank(local_98.mpi_comm,&local_98.m_rank);
  custom_op<double,true>::
  custom_op<mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::end_section(std::__cxx11::string_const&)::_lambda(double,double)_1_>
            ((custom_op<double,true> *)&local_70);
  MPI_Allreduce(&local_78,&local_a8,1,local_70.m_type_copy,local_70.m_op,local_98.mpi_comm);
  local_28 = local_a8;
  custom_op<double,_true>::~custom_op(&local_70);
  mxx::comm::~comm(&local_98);
  local_98._vptr_comm = (_func_int **)&PTR__comm_00150510;
  local_98.mpi_comm = this->comm;
  local_98.do_free = false;
  MPI_Comm_size(local_98.mpi_comm,&local_98.m_size);
  MPI_Comm_rank(local_98.mpi_comm,&local_98.m_rank);
  custom_op<double,true>::
  custom_op<mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::end_section(std::__cxx11::string_const&)::_lambda(double,double)_2_>
            ((custom_op<double,true> *)&local_70);
  MPI_Allreduce(&local_78,&local_a8,1,local_70.m_type_copy,local_70.m_op,local_98.mpi_comm);
  local_30 = local_a8;
  custom_op<double,_true>::~custom_op(&local_70);
  mxx::comm::~comm(&local_98);
  local_98._vptr_comm = (_func_int **)&PTR__comm_00150510;
  local_98.mpi_comm = this->comm;
  local_98.do_free = false;
  MPI_Comm_size(local_98.mpi_comm,&local_98.m_size);
  MPI_Comm_rank(local_98.mpi_comm,&local_98.m_rank);
  custom_op<double,true>::custom_op<std::plus<double>>((custom_op<double,true> *)&local_70);
  MPI_Allreduce(&local_78,&local_a8,1,local_70.m_type_copy,local_70.m_op,local_98.mpi_comm);
  local_a0 = local_a8;
  custom_op<double,_true>::~custom_op(&local_70);
  mxx::comm::~comm(&local_98);
  MPI_Comm_rank(this->comm,&local_98);
  MPI_Comm_size(this->comm,&local_70);
  if ((int)local_98._vptr_comm == this->root) {
    local_a0 = local_a0 / (double)(int)local_70._vptr_custom_op;
    poVar2 = this->ostr;
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 8) = 3;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xfffffefb | 0x100;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"TIMER",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    poVar2 = std::ostream::_M_insert<double>(local_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    poVar2 = std::ostream::_M_insert<double>(local_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    poVar2 = std::ostream::_M_insert<double>(local_30);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>
                               ::depth);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  MPI_Barrier(this->comm);
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->start).__d.__r = rVar3;
  return;
}

Assistant:

void end_section(const std::string& name) {
        std::chrono::steady_clock::time_point stop = std::chrono::steady_clock::now();
        time_rep elapsed = duration(stop-start).count();
        // TODO: reduce rather than allreduce
        // TODO: use single reduction with custom operator
        time_rep min = mxx::allreduce(elapsed, [](time_rep x, time_rep y){return std::min(x,y);}, comm);
        time_rep max = mxx::allreduce(elapsed, [](time_rep x, time_rep y){return std::max(x,y);}, comm);
        time_rep sum = mxx::allreduce(elapsed, std::plus<time_rep>(), comm);
        // calc mean:
        int p, rank;
        MPI_Comm_rank(comm, &rank);
        MPI_Comm_size(comm, &p);
        time_rep mean = sum / (double)p;
        // only root process outputs the timings
        if (rank == root)
            ostr << std::setprecision(3) << std::scientific << "TIMER" << sep << min << sep << mean << sep << max << sep << depth << sep << name << std::endl;
        // restart timer
        MPI_Barrier(comm);
        start = std::chrono::steady_clock::now();
    }